

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

void __thiscall
QItemSelectionModelPrivate::rowsAboutToBeRemoved
          (QItemSelectionModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QItemSelection *this_00;
  QObject *this_01;
  QPersistentModelIndexData *pQVar1;
  QPersistentModelIndexData *pQVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  parameter_type pQVar7;
  iterator pos;
  iterator iVar8;
  undefined4 in_register_0000000c;
  QPersistentModelIndex *pQVar9;
  QAbstractItemModel *pQVar10;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *pQVar11;
  long in_FS_OFFSET;
  QModelIndex local_f8;
  QItemSelectionRange local_d8;
  QModelIndex local_c8;
  QModelIndex local_b0;
  QModelIndex local_98;
  QModelIndex local_78;
  undefined8 local_58;
  QItemSelectionRange *pQStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  finalize(this);
  pQVar9 = &this->currentIndex;
  bVar3 = QPersistentModelIndex::isValid(pQVar9);
  if (!bVar3) goto LAB_00400b2f;
  QPersistentModelIndex::parent((QModelIndex *)&local_58,pQVar9);
  bVar3 = ::comparesEqual(parent,(QModelIndex *)&local_58);
  if (!bVar3) goto LAB_00400b2f;
  iVar5 = QPersistentModelIndex::row(pQVar9);
  if (iVar5 < start) goto LAB_00400b2f;
  iVar5 = QPersistentModelIndex::row(pQVar9);
  if (end < iVar5) goto LAB_00400b2f;
  local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar9);
  if (start < 1) {
    pQVar11 = &this->model;
    pQVar7 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             ::value(pQVar11);
    if (pQVar7 != (parameter_type)0x0) {
      QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
      ::value(pQVar11);
      pQVar10 = (pQVar11->super_QPropertyData<QAbstractItemModel_*>).val;
      iVar5 = (*(pQVar10->super_QObject)._vptr_QObject[0xf])(pQVar10,parent);
      if (end < iVar5 + -1) {
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar11);
        pQVar10 = (pQVar11->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar6 = end + 1;
        goto LAB_00400a23;
      }
    }
    local_78.r = -1;
    local_78.c = -1;
    local_78.i = 0;
    local_78.m.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(&this->model);
    pQVar10 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
    uVar6 = start - 1;
LAB_00400a23:
    (*(pQVar10->super_QObject)._vptr_QObject[0xc])
              (&local_78,pQVar10,(ulong)uVar6,(ulong)local_58 >> 0x20,parent);
  }
  QPersistentModelIndex::operator=(pQVar9,&local_78);
  QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar9);
  QItemSelectionModel::currentChanged
            ((QItemSelectionModel *)this_01,&local_78,(QModelIndex *)&local_58);
  QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar9);
  QItemSelectionModel::currentRowChanged
            ((QItemSelectionModel *)this_01,&local_78,(QModelIndex *)&local_58);
  iVar5 = QPersistentModelIndex::column(pQVar9);
  if (iVar5 != local_58._4_4_) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar9);
    QItemSelectionModel::currentColumnChanged
              ((QItemSelectionModel *)this_01,&local_78,(QModelIndex *)&local_58);
  }
LAB_00400b2f:
  local_58 = (Data *)0x0;
  pQStack_50 = (QItemSelectionRange *)0x0;
  local_48.ptr = (QAbstractItemModel *)0x0;
  local_78.r = 0;
  local_78.c = 0;
  local_78.i = 0;
  local_78.m.ptr = (QAbstractItemModel *)0x0;
  this_00 = &this->ranges;
  pos = QList<QItemSelectionRange>::begin(&this_00->super_QList<QItemSelectionRange>);
  pQVar11 = &this->model;
  bVar3 = false;
LAB_00400b8c:
  while( true ) {
    iVar8 = QList<QItemSelectionRange>::end(&this_00->super_QList<QItemSelectionRange>);
    if (pos.i == iVar8.i) {
      QList<QItemSelectionRange>::append
                (&this_00->super_QList<QItemSelectionRange>,(QList<QItemSelectionRange> *)&local_78)
      ;
      if (local_48.ptr != (QAbstractItemModel *)0x0 || bVar3) {
        local_98._0_8_ = (undefined1 *)0x0;
        local_98.i = 0;
        local_98.m.ptr = (QAbstractItemModel *)0x0;
        QItemSelectionModel::selectionChanged
                  ((QItemSelectionModel *)this_01,(QItemSelection *)&local_98,
                   (QItemSelection *)&local_58);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                  ((QArrayDataPointer<QItemSelectionRange> *)&local_98);
      }
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                ((QArrayDataPointer<QItemSelectionRange> *)&local_78);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                ((QArrayDataPointer<QItemSelectionRange> *)&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    QPersistentModelIndex::parent(&local_98,&(pos.i)->tl);
    bVar4 = ::operator!=(&local_98,parent);
    if (!bVar4) break;
    local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::parent(&local_98,&(pos.i)->tl);
    while( true ) {
      if (((local_98.r < 0) || ((long)local_98._0_8_ < 0)) ||
         (local_98.m.ptr == (QAbstractItemModel *)0x0)) goto LAB_0040109b;
      QModelIndex::parent(&local_b0,&local_98);
      bVar4 = ::operator!=(&local_b0,parent);
      if (!bVar4) break;
      QModelIndex::parent(&local_b0,&local_98);
      local_98.m.ptr = local_b0.m.ptr;
      local_98._0_8_ = local_b0._0_8_;
      local_98.i = local_b0.i;
    }
LAB_0040109b:
    if (((local_98.r < 0) || (local_98.c < 0)) || (local_98.m.ptr == (QAbstractItemModel *)0x0))
    goto LAB_00400f90;
    if (end < local_98.r || local_98.r < start) {
      bVar3 = (bool)(bVar3 | end < local_98.r);
      goto LAB_00400f90;
    }
    QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
              ((QList<QItemSelectionRange> *)&local_58,pos.i);
    pos = QList<QItemSelectionRange>::erase(&this_00->super_QList<QItemSelectionRange>,pos.i);
  }
  pQVar9 = &(pos.i)->br;
  iVar5 = QPersistentModelIndex::row(pQVar9);
  if (start <= iVar5) {
    iVar5 = QPersistentModelIndex::row(pQVar9);
    if (iVar5 <= end) {
      iVar5 = QPersistentModelIndex::row(&(pos.i)->tl);
      if (start <= iVar5) {
        iVar5 = QPersistentModelIndex::row(&(pos.i)->tl);
        if (iVar5 <= end) {
          QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
                    ((QList<QItemSelectionRange> *)&local_58,pos.i);
          pos = QList<QItemSelectionRange>::erase(&this_00->super_QList<QItemSelectionRange>,pos.i);
          goto LAB_00400b8c;
        }
      }
    }
  }
  iVar5 = QPersistentModelIndex::row(&(pos.i)->tl);
  if (iVar5 < start) {
LAB_00400c24:
    iVar5 = QPersistentModelIndex::row(pQVar9);
    if (start <= iVar5) {
      iVar5 = QPersistentModelIndex::row(pQVar9);
      if (iVar5 <= end) {
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar11);
        pQVar10 = (pQVar11->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar6 = QPersistentModelIndex::column(&(pos.i)->tl);
        QPersistentModelIndex::parent(&local_b0,&(pos.i)->tl);
        (*(pQVar10->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar10,(ulong)(uint)start,(ulong)uVar6,&local_b0);
        QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar9);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)&local_f8,&local_98,&local_c8);
        QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
                  ((QList<QItemSelectionRange> *)&local_58,(QItemSelectionRange *)&local_f8);
        QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&(pos.i)->tl);
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar11);
        pQVar10 = (pQVar11->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar6 = QPersistentModelIndex::column(pQVar9);
        QPersistentModelIndex::parent(&local_c8,&(pos.i)->tl);
        (*(pQVar10->super_QObject)._vptr_QObject[0xc])
                  (&local_b0,pQVar10,(ulong)(start - 1),(ulong)uVar6,&local_c8);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)&local_f8,&local_98,&local_b0);
        pQVar1 = ((pos.i)->tl).d;
        pQVar2 = ((pos.i)->br).d;
        ((pos.i)->tl).d = (QPersistentModelIndexData *)local_f8._0_8_;
        ((pos.i)->br).d = (QPersistentModelIndexData *)local_f8.i;
        local_f8._0_8_ = pQVar1;
        local_f8.i = (quintptr)pQVar2;
        goto LAB_00400f8b;
      }
    }
    iVar5 = QPersistentModelIndex::row(&(pos.i)->tl);
    if (iVar5 < start) {
      iVar5 = QPersistentModelIndex::row(pQVar9);
      if (end < iVar5) {
        local_d8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar11);
        pQVar10 = (pQVar11->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar6 = QPersistentModelIndex::column(&(pos.i)->tl);
        QPersistentModelIndex::parent(&local_b0,&(pos.i)->tl);
        (*(pQVar10->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar10,(ulong)(uint)start,(ulong)uVar6,&local_b0);
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar11);
        pQVar10 = (pQVar11->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar6 = QPersistentModelIndex::column(pQVar9);
        QPersistentModelIndex::parent(&local_f8,&(pos.i)->tl);
        (*(pQVar10->super_QObject)._vptr_QObject[0xc])
                  (&local_c8,pQVar10,CONCAT44(in_register_0000000c,end),(ulong)uVar6,&local_f8);
        QItemSelectionRange::QItemSelectionRange(&local_d8,&local_98,&local_c8);
        QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange_const&>
                  ((QList<QItemSelectionRange> *)&local_58,&local_d8);
        QItemSelection::split(pos.i,&local_d8,(QItemSelection *)&local_78);
        pos = QList<QItemSelectionRange>::erase(&this_00->super_QList<QItemSelectionRange>,pos.i);
        QItemSelectionRange::~QItemSelectionRange(&local_d8);
        goto LAB_00400b8c;
      }
    }
    iVar5 = QPersistentModelIndex::row(&(pos.i)->tl);
    pos.i = pos.i + 1;
    bVar3 = (bool)(bVar3 | end < iVar5);
  }
  else {
    iVar5 = QPersistentModelIndex::row(&(pos.i)->tl);
    if (end < iVar5) goto LAB_00400c24;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&(pos.i)->tl);
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(pQVar11);
    pQVar10 = (pQVar11->super_QPropertyData<QAbstractItemModel_*>).val;
    uVar6 = QPersistentModelIndex::column(pQVar9);
    QPersistentModelIndex::parent(&local_c8,&(pos.i)->tl);
    (*(pQVar10->super_QObject)._vptr_QObject[0xc])
              (&local_b0,pQVar10,CONCAT44(in_register_0000000c,end),(ulong)uVar6,&local_c8);
    QItemSelectionRange::QItemSelectionRange((QItemSelectionRange *)&local_f8,&local_98,&local_b0);
    QList<QItemSelectionRange>::emplaceBack<QItemSelectionRange>
              ((QList<QItemSelectionRange> *)&local_58,(QItemSelectionRange *)&local_f8);
    QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_f8);
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(pQVar11);
    pQVar10 = (pQVar11->super_QPropertyData<QAbstractItemModel_*>).val;
    uVar6 = QPersistentModelIndex::column(&(pos.i)->tl);
    QPersistentModelIndex::parent(&local_b0,&(pos.i)->tl);
    (*(pQVar10->super_QObject)._vptr_QObject[0xc])
              (&local_98,pQVar10,(ulong)(end + 1),(ulong)uVar6,&local_b0);
    QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar9);
    QItemSelectionRange::QItemSelectionRange((QItemSelectionRange *)&local_f8,&local_98,&local_c8);
    pQVar1 = ((pos.i)->tl).d;
    pQVar2 = ((pos.i)->br).d;
    ((pos.i)->tl).d = (QPersistentModelIndexData *)local_f8._0_8_;
    ((pos.i)->br).d = (QPersistentModelIndexData *)local_f8.i;
    local_f8._0_8_ = pQVar1;
    local_f8.i = (quintptr)pQVar2;
LAB_00400f8b:
    QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)&local_f8);
LAB_00400f90:
    pos.i = pos.i + 1;
  }
  goto LAB_00400b8c;
}

Assistant:

void QItemSelectionModelPrivate::rowsAboutToBeRemoved(const QModelIndex &parent,
                                                         int start, int end)
{
    Q_Q(QItemSelectionModel);
    Q_ASSERT(start <= end);
    finalize();

    // update current index
    if (currentIndex.isValid() && parent == currentIndex.parent()
        && currentIndex.row() >= start && currentIndex.row() <= end) {
        QModelIndex old = currentIndex;
        if (start > 0) {
            // there are rows left above the change
            currentIndex = model->index(start - 1, old.column(), parent);
        } else if (model.value() && end < model->rowCount(parent) - 1) {
            // there are rows left below the change
            currentIndex = model->index(end + 1, old.column(), parent);
        } else {
            // there are no rows left in the table
            currentIndex = QModelIndex();
        }
        emit q->currentChanged(currentIndex, old);
        emit q->currentRowChanged(currentIndex, old);
        if (currentIndex.column() != old.column())
            emit q->currentColumnChanged(currentIndex, old);
    }

    QItemSelection deselected;
    QItemSelection newParts;
    bool indexesOfSelectionChanged = false;
    QItemSelection::iterator it = ranges.begin();
    while (it != ranges.end()) {
        if (it->topLeft().parent() != parent) {  // Check parents until reaching root or contained in range
            QModelIndex itParent = it->topLeft().parent();
            while (itParent.isValid() && itParent.parent() != parent)
                itParent = itParent.parent();

            if (itParent.isValid() && start <= itParent.row() && itParent.row() <= end) {
                deselected.append(*it);
                it = ranges.erase(it);
            } else {
                if (itParent.isValid() && end < itParent.row())
                    indexesOfSelectionChanged = true;
                ++it;
            }
        } else if (start <= it->bottom() && it->bottom() <= end    // Full inclusion
                   && start <= it->top() && it->top() <= end) {
            deselected.append(*it);
            it = ranges.erase(it);
        } else if (start <= it->top() && it->top() <= end) {      // Top intersection
            deselected.append(QItemSelectionRange(it->topLeft(), model->index(end, it->right(), it->parent())));
            *it = QItemSelectionRange(model->index(end + 1, it->left(), it->parent()), it->bottomRight());
            ++it;
        } else if (start <= it->bottom() && it->bottom() <= end) {    // Bottom intersection
            deselected.append(QItemSelectionRange(model->index(start, it->left(), it->parent()), it->bottomRight()));
            *it = QItemSelectionRange(it->topLeft(), model->index(start - 1, it->right(), it->parent()));
            ++it;
        } else if (it->top() < start && end < it->bottom()) { // Middle intersection
            // If the parent contains (1, 2, 3, 4, 5, 6, 7, 8) and [3, 4, 5, 6] is selected,
            // and [4, 5] is removed, we need to split [3, 4, 5, 6] into [3], [4, 5] and [6].
            // [4, 5] is appended to deselected, and [3] and [6] remain part of the selection
            // in ranges.
            const QItemSelectionRange removedRange(model->index(start, it->left(), it->parent()),
                                                    model->index(end, it->right(), it->parent()));
            deselected.append(removedRange);
            QItemSelection::split(*it, removedRange, &newParts);
            it = ranges.erase(it);
        } else if (end < it->top()) { // deleted row before selection
            indexesOfSelectionChanged = true;
            ++it;
        } else {
            ++it;
        }
    }
    ranges.append(newParts);

    if (!deselected.isEmpty() || indexesOfSelectionChanged)
        emit q->selectionChanged(QItemSelection(), deselected);
}